

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M3DExporter.cpp
# Opt level: O3

void Assimp::ExportSceneM3DA
               (char *pFile,IOSystem *pIOSystem,aiScene *pScene,ExportProperties *pProperties)

{
  runtime_error *this;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"Assimp configured without M3D_ASCII support","");
  std::runtime_error::runtime_error(this,(string *)local_40);
  *(undefined ***)this = &PTR__runtime_error_0080bf48;
  __cxa_throw(this,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ExportSceneM3DA(
		const char *pFile,
		IOSystem *pIOSystem,
		const aiScene *pScene,
		const ExportProperties *pProperties

) {
#ifdef M3D_ASCII
	// initialize the exporter
	M3DExporter exporter(pScene, pProperties);

	// perform ascii export
	exporter.doExport(pFile, pIOSystem, true);
#else
	throw DeadlyExportError("Assimp configured without M3D_ASCII support");
#endif
}